

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,false,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  idx_t iVar12;
  ulong uVar13;
  long lVar14;
  sel_t sVar15;
  long lVar16;
  unsigned_long uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  
  if (count + 0x3f < 0x40) {
    iVar12 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar12 = 0;
    lVar16 = 0;
    uVar9 = 0;
    uVar19 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar17 = 0xffffffffffffffff;
      }
      else {
        uVar17 = puVar1[uVar9];
      }
      uVar13 = uVar19 + 0x40;
      if (count <= uVar19 + 0x40) {
        uVar13 = count;
      }
      uVar8 = uVar19;
      if (uVar17 == 0xffffffffffffffff) {
        if (uVar19 < uVar13) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          uVar10 = uVar19 << 4 | 8;
          do {
            uVar8 = uVar19;
            if (psVar2 != (sel_t *)0x0) {
              uVar8 = (ulong)psVar2[uVar19];
            }
            lVar5 = *(long *)((long)&ldata->months + uVar10);
            lVar14 = (long)*(int *)((long)ldata + (uVar10 - 4)) + lVar5 / 86400000000;
            lVar11 = (long)*(int *)((long)ldata + (uVar10 - 8)) + lVar14 / 0x1e;
            lVar6 = *(long *)((long)&rdata->months + uVar10);
            lVar20 = (long)*(int *)((long)rdata + (uVar10 - 4)) + lVar6 / 86400000000;
            lVar18 = (long)*(int *)((long)rdata + (uVar10 - 8)) + lVar20 / 0x1e;
            bVar7 = true;
            if (lVar11 <= lVar18) {
              if (lVar11 < lVar18) {
                bVar7 = false;
              }
              else {
                lVar14 = lVar14 % 0x1e;
                lVar20 = lVar20 % 0x1e;
                if (lVar14 <= lVar20) {
                  bVar7 = lVar6 % 86400000000 < lVar5 % 86400000000 && lVar20 <= lVar14;
                }
              }
            }
            psVar3[iVar12] = (sel_t)uVar8;
            iVar12 = iVar12 + bVar7;
            psVar4[lVar16] = (sel_t)uVar8;
            lVar16 = lVar16 + (ulong)(bVar7 ^ 1);
            uVar19 = uVar19 + 1;
            uVar10 = uVar10 + 0x10;
            uVar8 = uVar19;
          } while (uVar13 != uVar19);
        }
      }
      else if (uVar17 == 0) {
        uVar8 = uVar13;
        if (uVar19 < uVar13) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar15 = (sel_t)uVar19;
            if (psVar2 != (sel_t *)0x0) {
              sVar15 = psVar2[uVar19];
            }
            psVar3[lVar16] = sVar15;
            lVar16 = lVar16 + 1;
            uVar19 = uVar19 + 1;
          } while (uVar13 != uVar19);
        }
      }
      else if (uVar19 < uVar13) {
        psVar2 = sel->sel_vector;
        psVar3 = true_sel->sel_vector;
        psVar4 = false_sel->sel_vector;
        uVar8 = uVar19 << 4 | 8;
        uVar10 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar15 = (int)uVar19 + (int)uVar10;
          }
          else {
            sVar15 = psVar2[uVar19 + uVar10];
          }
          if ((uVar17 >> (uVar10 & 0x3f) & 1) == 0) {
            bVar7 = false;
          }
          else {
            lVar5 = *(long *)((long)&ldata->months + uVar8);
            lVar20 = (long)*(int *)((long)ldata + (uVar8 - 4)) + lVar5 / 86400000000;
            lVar14 = (long)*(int *)((long)ldata + (uVar8 - 8)) + lVar20 / 0x1e;
            lVar6 = *(long *)((long)&rdata->months + uVar8);
            lVar11 = (long)*(int *)((long)rdata + (uVar8 - 4)) + lVar6 / 86400000000;
            lVar18 = (long)*(int *)((long)rdata + (uVar8 - 8)) + lVar11 / 0x1e;
            bVar7 = true;
            if (lVar14 <= lVar18) {
              if (lVar14 < lVar18) {
                bVar7 = false;
              }
              else {
                lVar20 = lVar20 % 0x1e;
                lVar11 = lVar11 % 0x1e;
                bVar7 = true;
                if (lVar20 <= lVar11) {
                  bVar7 = lVar6 % 86400000000 < lVar5 % 86400000000 && lVar11 <= lVar20;
                }
              }
            }
          }
          psVar3[iVar12] = sVar15;
          iVar12 = iVar12 + bVar7;
          psVar4[lVar16] = sVar15;
          lVar16 = (ulong)(bVar7 ^ 1) + lVar16;
          uVar10 = uVar10 + 1;
          uVar8 = uVar8 + 0x10;
        } while ((uVar19 - uVar13) + uVar10 != 0);
        uVar8 = uVar19 + uVar10;
      }
      uVar9 = uVar9 + 1;
      uVar19 = uVar8;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return iVar12;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}